

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.hpp
# Opt level: O3

Matrix<int> __thiscall Matrix<int>::operator-(Matrix<int> *this,Matrix<int> *M1)

{
  uint b;
  int **ppiVar1;
  int *piVar2;
  int *piVar3;
  long lVar4;
  int *piVar5;
  int **in_RDX;
  int **ppiVar6;
  int **extraout_RDX;
  long lVar7;
  int iVar8;
  ulong uVar9;
  long lVar10;
  Matrix<int> MVar11;
  
  ppiVar6 = in_RDX;
  if (M1->n == *(int *)in_RDX) {
    b = M1->m;
    ppiVar6 = (int **)(ulong)b;
    if (b == *(uint *)((long)in_RDX + 4)) {
      Matrix(this,M1->n,b);
      iVar8 = M1->n;
      ppiVar6 = extraout_RDX;
      if (0 < iVar8) {
        ppiVar1 = M1->M;
        piVar2 = in_RDX[1];
        ppiVar6 = this->M;
        uVar9 = (ulong)(uint)M1->m;
        lVar7 = 0;
        do {
          if (0 < (int)uVar9) {
            piVar3 = ppiVar1[lVar7];
            lVar4 = *(long *)(piVar2 + lVar7 * 2);
            piVar5 = ppiVar6[lVar7];
            lVar10 = 0;
            do {
              piVar5[lVar10] = piVar3[lVar10] - *(int *)(lVar4 + lVar10 * 4);
              lVar10 = lVar10 + 1;
              uVar9 = (ulong)M1->m;
            } while (lVar10 < (long)uVar9);
            iVar8 = M1->n;
          }
          lVar7 = lVar7 + 1;
        } while (lVar7 < iVar8);
      }
      goto LAB_0010b577;
    }
  }
  this->n = 0;
  this->m = 0;
  this->M = (int **)0x0;
LAB_0010b577:
  MVar11.M = ppiVar6;
  MVar11._0_8_ = this;
  return MVar11;
}

Assistant:

Matrix operator-(Matrix& M1) const {
    if (n != M1.n || m != M1.m) {
      Matrix<T> Zero;
      return Zero;
    }
    Matrix<T> sub(n, m);
    for (int i = 0; i < n; i++) {
      for (int j = 0; j < m; j++) {
        sub.M[i][j] = M[i][j] - M1.M[i][j];
      }
    }
    return sub;
  }